

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
consistentStringProperty
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,string *lhs,string *rhs)

{
  __type _Var1;
  string sStack_38;
  
  _Var1 = std::operator==(lhs,rhs);
  if (_Var1) {
    std::__cxx11::string::string((string *)&sStack_38,(string *)lhs);
  }
  else {
    valueAsString<decltype(nullptr)>(&sStack_38,rhs);
  }
  __return_storage_ptr__->first = _Var1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> consistentStringProperty(const std::string& lhs,
                                                      const std::string& rhs)
{
  const bool b = lhs == rhs;
  return std::make_pair(b, b ? lhs : valueAsString(nullptr));
}